

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcmain3.c
# Opt level: O1

LispPTR gcmapscan(void)

{
  LispPTR *pLVar1;
  LispPTR *pLVar2;
  int probe;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  
  probe = gcscan1(0x8000);
  pLVar2 = HTmain;
  do {
    if (probe == -1) {
      HTmain = pLVar2;
      return 0;
    }
    HTmain = pLVar2;
    while (uVar3 = pLVar2[probe], (uVar3 & 1) != 0) {
      puVar4 = HTcoll + (uVar3 & 0xfffffffe);
      uVar3 = *puVar4;
      if (uVar3 < 0x10000) {
        puVar5 = (uint *)0x0;
      }
      else {
        do {
          puVar5 = puVar4;
          if ((ulong)puVar5[1] == 0) goto LAB_00124ac9;
          puVar4 = HTcoll + puVar5[1];
          uVar3 = *puVar4;
        } while (0xffff < uVar3);
      }
      if (puVar5 == (uint *)0x0) {
        pLVar2[probe] = puVar4[1] | 1;
      }
      else {
        puVar5[1] = puVar4[1];
      }
      *puVar4 = 0;
      puVar4[1] = *HTcoll;
      *HTcoll = (LispPTR)((ulong)((long)puVar4 - (long)HTcoll) >> 2);
      if (HTcoll[(ulong)(pLVar2[probe] & 0xfffffffe) + 1] == 0) {
        pLVar1 = HTcoll + (pLVar2[probe] & 0xfffffffe);
        pLVar2[probe] = *pLVar1;
        *pLVar1 = 0;
        pLVar1[1] = *HTcoll;
        *HTcoll = (LispPTR)((ulong)((long)pLVar1 - (long)HTcoll) >> 2);
      }
      for (uVar3 = gcreccell((uVar3 & 0xfffe) << 0xf | probe * 2); uVar3 != 0;
          uVar3 = gcreccell(uVar3)) {
        if ((-1 < *(short *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(uVar3,0);
        }
      }
      if (pLVar2[probe] == 0) goto LAB_00124ac9;
    }
    if (uVar3 < 0x10000) {
      pLVar2[probe] = 0;
      for (uVar3 = gcreccell(uVar3 << 0xf | probe * 2); uVar3 != 0; uVar3 = gcreccell(uVar3)) {
        if ((-1 < *(short *)((ulong)(uVar3 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(uVar3,0);
        }
      }
    }
LAB_00124ac9:
    probe = gcscan1(probe);
    pLVar2 = HTmain;
  } while( true );
}

Assistant:

LispPTR gcmapscan(void) {
  int probe;
  GCENTRY *entry;
  GCENTRY offset, dbgcontents;
  LispPTR ptr;

  probe = HTMAIN_ENTRY_COUNT;
nextentry:
  while ((probe = gcscan1(probe)) != -1) {
    entry = (GCENTRY *)HTmain + probe;
  retry:
    if (HENTRY->collision) {
      GCENTRY *prev;
      GCENTRY *link;
      LispPTR content;

      prev = (GCENTRY *)0;
      link = (GCENTRY *)HTcoll + GetLinkptr((content = HTLPTR->contents));
    linkloop:
      offset = ((struct htcoll *)link)->free_ptr;
      if (StkCntIsZero(offset)) {
        /* Reclaimable object */
        ptr = VAG2(GetSegnuminColl(offset), (probe << 1));
        DelLink(link, prev, entry);
        GcreclaimLp(ptr);
        if (HTLPTR->contents == 0)
          goto nextentry;
        else
          goto retry;
      }
      if ((offset = ((struct htcoll *)link)->next_free)) {
        prev = link;
        link = (GCENTRY *)(HTcoll + offset);
        goto linkloop;
      }
      goto nextentry;
    }
    if (StkCntIsZero(dbgcontents = HTLPTR->contents)) {
      ptr = VAG2(HENTRY->segnum, (probe << 1));
      HTLPTR->contents = 0;
      GcreclaimLp(ptr);
    }
  }
  return (NIL);
}